

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O3

boolean throwing_weapon(obj *obj)

{
  byte bVar1;
  short sVar2;
  
  if ((byte)(obj->oclass | 4U) == 6) {
    sVar2 = obj->otyp;
    bVar1 = objects[sVar2].oc_subtyp;
    if ((byte)(bVar1 + 0x1b) < 3) {
      return '\x01';
    }
    if (obj->oclass == 2) {
      if ((bVar1 & 0xfe) == 0x12) {
        return '\x01';
      }
      if ((0xfb < (byte)(bVar1 - 5)) && ((objects[sVar2].field_0x11 & 4) != 0)) {
        return '\x01';
      }
    }
  }
  else {
    sVar2 = obj->otyp;
  }
  if (sVar2 == 0x3b) {
    return '\x01';
  }
  return sVar2 == 0x3f;
}

Assistant:

boolean throwing_weapon(const struct obj *obj)
{
	return (is_missile(obj) || is_spear(obj) ||
		/* daggers and knife (excludes scalpel) */
		(is_blade(obj) && !is_sword(obj) &&
		 (objects[obj->otyp].oc_dir & PIERCE)) ||
		/* special cases [might want to add AXE] */
		obj->otyp == WAR_HAMMER || obj->otyp == AKLYS);
}